

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMovemRgEa<(moira::Instr)78,(moira::Mode)4,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  u32 uVar3;
  StrWriter *pSVar4;
  Ea<(moira::Mode)4,_2> dst;
  u32 local_34;
  ushort local_30;
  
  uVar3 = dasmIncRead<2>(this,addr);
  local_30 = op & 7;
  local_34 = *addr;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)(uVar3 & 0xff) * 0x202020202 & 0x10884422010;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (ulong)(uVar3 >> 8 & 0xff) * 0x202020202 & 0x10884422010;
  pSVar4 = StrWriter::operator<<(str);
  pSVar4 = StrWriter::operator<<(pSVar4);
  StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
  StrWriter::operator<<
            (pSVar4,(RegRegList)
                    (SUB162(auVar2 % ZEXT816(0x3ff),0) & 0xff |
                    (ushort)(SUB164(auVar1 % ZEXT816(0x3ff),0) << 8)));
  StrWriter::operator<<(pSVar4);
  StrWriter::operator<<(pSVar4,(Ea<(moira::Mode)4,_2> *)&local_34);
  return;
}

Assistant:

void
Moira::dasmMovemRgEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = RegRegList ( (u16)dasmIncRead<Word>(addr)  );
    auto dst = Op <M,S>   ( _____________xxx(op), addr );

    if constexpr (M == Mode(4)) { src.raw = REVERSE_16(src.raw); }
    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}